

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readString(Reader *this)

{
  Reader *in_RDI;
  Char c;
  Char local_9;
  
  local_9 = '\0';
  do {
    while( true ) {
      if (in_RDI->current_ == in_RDI->end_) goto LAB_001e840d;
      local_9 = getNextChar(in_RDI);
      if (local_9 != '\\') break;
      getNextChar(in_RDI);
    }
  } while (local_9 != '\"');
LAB_001e840d:
  return local_9 == '\"';
}

Assistant:

bool Reader::readString() {
  Char c = '\0';
  while (current_ != end_) {
    c = getNextChar();
    if (c == '\\')
      getNextChar();
    else if (c == '"')
      break;
  }
  return c == '"';
}